

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O0

bool __thiscall
OpenMD::ForceDecomposition::checkNeighborList
          (ForceDecomposition *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *savedPositions
          )

{
  size_type sVar1;
  double *pdVar2;
  DataStorage *in_RSI;
  Vector<double,_3U> *in_RDI;
  size_t i;
  Vector3d disp;
  RealType dispmax;
  size_t nGroups;
  RealType st2;
  undefined8 in_stack_ffffffffffffff78;
  int __y;
  double local_70 [4];
  size_type local_50;
  double local_30;
  size_type local_28;
  __type local_20;
  bool local_1;
  
  __y = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_20 = std::pow<double,int>((double)in_RSI,__y);
  local_28 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                       ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)((long)in_RDI[1].data_[0] + 0x380));
  if ((*(byte *)((long)in_RDI[2].data_ + 0xc) & 1) != 0) {
    DataStorage::setStorageLayout(in_RSI,__y);
  }
  sVar1 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                    (&in_RSI->position);
  if (sVar1 == local_28) {
    local_30 = 0.0;
    Vector3<double>::Vector3((Vector3<double> *)0x17f704);
    for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 ((long)in_RDI[1].data_[0] + 0x380),local_50);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&in_RSI->position,local_50);
      OpenMD::operator-(in_RDI,(Vector<double,_3U> *)in_RSI);
      Vector3<double>::operator=((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_RSI);
      local_70[0] = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x17f774);
      pdVar2 = std::max<double>(&local_30,local_70);
      local_30 = *pdVar2;
    }
    local_1 = local_20 < local_30;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ForceDecomposition::checkNeighborList(vector<Vector3d> savedPositions) {
    RealType st2        = pow(skinThickness_ / 2.0, 2);
    std::size_t nGroups = snap_->cgData.position.size();
    if (needVelocities_)
      snap_->cgData.setStorageLayout(DataStorage::dslPosition |
                                     DataStorage::dslVelocity);

    // if we have changed the group identities or haven't set up the
    // saved positions we automatically will need a neighbor list update:

    if (savedPositions.size() != nGroups) return true;

    RealType dispmax = 0.0;
    Vector3d disp;

    for (std::size_t i = 0; i < nGroups; i++) {
      disp    = snap_->cgData.position[i] - savedPositions[i];
      dispmax = max(dispmax, disp.lengthSquare());
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &dispmax, 1, MPI_REALTYPE, MPI_MAX,
                  MPI_COMM_WORLD);
#endif

    return (dispmax > st2) ? true : false;
  }